

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Apu.cpp
# Opt level: O2

int __thiscall Gb_Apu::read_register(Gb_Apu *this,blip_time_t time,uint addr)

{
  Gb_Osc *pGVar1;
  uint uVar2;
  int i;
  long lVar3;
  
  run_until(this,time);
  uVar2 = (uint)this->regs[(int)(addr - 0xff10)];
  if (addr == 0xff26) {
    uVar2 = this->regs[(int)(addr - 0xff10)] & 0xffffff80 | 0x70;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      pGVar1 = this->oscs[lVar3];
      if ((pGVar1->enabled != 0) && ((pGVar1->length != 0 || ((pGVar1->regs[4] & 0x40) == 0)))) {
        uVar2 = uVar2 | 1 << ((uint)lVar3 & 0x1f);
      }
    }
  }
  return uVar2;
}

Assistant:

int Gb_Apu::read_register( blip_time_t time, unsigned addr )
{
	run_until( time );
	
	int index = addr - start_addr;
	require( (unsigned) index < register_count );
	int data = regs [index];
	
	if ( addr == status_reg )
	{
		data = (data & 0x80) | 0x70;
		for ( int i = 0; i < osc_count; i++ )
		{
			const Gb_Osc& osc = *oscs [i];
			if ( osc.enabled && (osc.length || !(osc.regs [4] & osc.len_enabled_mask)) )
				data |= 1 << i;
		}
	}
	
	return data;
}